

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstructionHeuristics.cpp
# Opt level: O2

map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* ConstructionHeuristics::countNurseSkills_abi_cxx11_(void)

{
  pointer pbVar1;
  pointer pNVar2;
  Scenario *pSVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  vector<Nurse,_std::allocator<Nurse>_> *pvVar5;
  mapped_type *pmVar6;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
  *in_RDI;
  string *skill;
  pointer pbVar7;
  __node_base _Var8;
  Nurse *nurse;
  pointer this;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  counter;
  undefined1 local_90 [40];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pSVar3 = Scenario::getInstance();
  pvVar4 = Scenario::getSkills_abi_cxx11_(pSVar3);
  pbVar1 = (pvVar4->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (pvVar4->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    std::__cxx11::string::string((string *)local_90,(string *)pbVar7);
    local_90._32_4_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,int>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_68,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
  }
  pSVar3 = Scenario::getInstance();
  pvVar5 = Scenario::getNurses(pSVar3);
  pNVar2 = (pvVar5->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (pvVar5->super__Vector_base<Nurse,_std::allocator<Nurse>_>)._M_impl.
              super__Vector_impl_data._M_start; this != pNVar2; this = this + 1) {
    pvVar4 = Nurse::getSkills_abi_cxx11_(this);
    pbVar1 = (pvVar4->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar7 = (pvVar4->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1)
    {
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)&local_68,pbVar7);
      *pmVar6 = *pmVar6 + 1;
    }
  }
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
    **)(in_RDI + 0x18) = in_RDI + 8;
  *(_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
    **)(in_RDI + 0x20) = in_RDI + 8;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  for (_Var8._M_nxt = local_68._M_before_begin._M_nxt; _Var8._M_nxt != (_Hash_node_base *)0x0;
      _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt) {
    std::
    pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<unsigned_int_&,_true>
              ((pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_90,(uint *)(_Var8._M_nxt + 5),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (_Var8._M_nxt + 1));
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<unsigned_int,std::__cxx11::string>>
              (in_RDI,(pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)in_RDI;
}

Assistant:

map<unsigned int, string> ConstructionHeuristics::countNurseSkills() {
    unordered_map<string, unsigned int> counter;

    for (const string &skill : Scenario::getInstance()->getSkills())
        counter.insert(make_pair(skill, 0));

    for (const Nurse &nurse : Scenario::getInstance()->getNurses())
        for (const string &skill : nurse.getSkills())
            counter.at(skill)++;

    //sort the map, key = counter and value = skill
    map<unsigned int, string> sortedCounter;
    for (auto &it : counter)
        sortedCounter.insert(make_pair(it.second, it.first));

    return sortedCounter;
}